

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent.c
# Opt level: O2

_Bool extent_commit_impl(tsdn_t *tsdn,ehooks_t *ehooks,edata_t *edata,size_t offset,size_t length,
                        _Bool growing_retained)

{
  ulong uVar1;
  extent_hooks_t *peVar2;
  byte bVar3;
  void *addr;
  
  addr = (void *)((ulong)edata->e_addr & 0xfffffffffffff000);
  uVar1 = (edata->field_2).e_size_esn;
  peVar2 = (extent_hooks_t *)(ehooks->ptr).repr;
  if (peVar2 == &duckdb_je_ehooks_default_extent_hooks) {
    bVar3 = duckdb_je_ehooks_default_commit_impl(addr,offset,length);
  }
  else if (peVar2->commit == (undefined1 *)0x0) {
    bVar3 = 1;
  }
  else {
    ehooks_pre_reentrancy(tsdn);
    bVar3 = (*(code *)peVar2->commit)
                      (peVar2,addr,uVar1 & 0xfffffffffffff000,offset,length,ehooks->ind);
    ehooks_post_reentrancy(tsdn);
  }
  edata->e_bits =
       (ulong)(((byte)(~bVar3 | (byte)(edata->e_bits >> 0xd)) & 1) << 0xd) |
       edata->e_bits & 0xffffffffffffdfff;
  return (_Bool)bVar3;
}

Assistant:

static bool
extent_commit_impl(tsdn_t *tsdn, ehooks_t *ehooks, edata_t *edata,
    size_t offset, size_t length, bool growing_retained) {
	witness_assert_depth_to_rank(tsdn_witness_tsdp_get(tsdn),
	    WITNESS_RANK_CORE, growing_retained ? 1 : 0);
	bool err = ehooks_commit(tsdn, ehooks, edata_base_get(edata),
	    edata_size_get(edata), offset, length);
	edata_committed_set(edata, edata_committed_get(edata) || !err);
	return err;
}